

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

Triangle * __thiscall
p2t::Sweep::NextFlipTriangle
          (Sweep *this,SweepContext *tcx,int o,Triangle *t,Triangle *ot,Point *p,Point *op)

{
  int iVar1;
  Triangle *pTVar2;
  
  pTVar2 = ot;
  if (o == 1) {
    pTVar2 = t;
    t = ot;
  }
  iVar1 = Triangle::EdgeIndex(t,p,op);
  t->delaunay_edge[iVar1] = true;
  Legalize(this,tcx,t);
  Triangle::ClearDelunayEdges(t);
  return pTVar2;
}

Assistant:

Triangle& Sweep::NextFlipTriangle(SweepContext& tcx, int o, Triangle& t, Triangle& ot, Point& p, Point& op)
{
  if (o == CCW) {
    // ot is not crossing edge after flip
    int edge_index = ot.EdgeIndex(&p, &op);
    ot.delaunay_edge[edge_index] = true;
    Legalize(tcx, ot);
    ot.ClearDelunayEdges();
    return t;
  }

  // t is not crossing edge after flip
  int edge_index = t.EdgeIndex(&p, &op);

  t.delaunay_edge[edge_index] = true;
  Legalize(tcx, t);
  t.ClearDelunayEdges();
  return ot;
}